

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_read_collapsed_image(nifti_image *nim,int *dims,void **data)

{
  char *data_00;
  void **dims_00;
  int *nim_00;
  int iVar1;
  uint uVar2;
  znzFile file;
  size_t base_offset;
  uint local_80;
  int bytes;
  int c;
  int nprods;
  int prods [8];
  int pivots [8];
  znzFile local_30;
  znzFile fp;
  void **data_local;
  int *dims_local;
  nifti_image *nim_local;
  
  fp = (znzFile)data;
  data_local = (void **)dims;
  dims_local = &nim->ndim;
  if (((nim == (nifti_image *)0x0) || (dims == (int *)0x0)) || (data == (void **)0x0)) {
    fprintf(_stderr,"** nifti_RCI: bad params %p, %p, %p\n",nim,dims,data);
    nim_local._4_4_ = 0xffffffff;
  }
  else {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d read_collapsed_image:\n        dims =");
      for (local_80 = 0; (int)local_80 < 8; local_80 = local_80 + 1) {
        fprintf(_stderr," %3d",(ulong)*(uint *)((long)data_local + (long)(int)local_80 * 4));
      }
      fprintf(_stderr,"\n   nim->dims =");
      for (local_80 = 0; (int)local_80 < 8; local_80 = local_80 + 1) {
        fprintf(_stderr," %3d",(ulong)(uint)dims_local[(long)(int)local_80 + 8]);
      }
      fputc(10,_stderr);
    }
    iVar1 = nifti_nim_is_valid((nifti_image *)dims_local,(uint)(0 < g_opts.debug));
    if (iVar1 == 0) {
      fprintf(_stderr,"** invalid nim (file is \'%s\')\n",*(undefined8 *)(dims_local + 0x9e));
      nim_local._4_4_ = 0xffffffff;
    }
    else {
      for (local_80 = 1; (int)local_80 <= dims_local[8]; local_80 = local_80 + 1) {
        if (dims_local[(long)(int)local_80 + 8] <=
            *(int *)((long)data_local + (long)(int)local_80 * 4)) {
          fprintf(_stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",(ulong)local_80,
                  (ulong)local_80,(ulong)*(uint *)((long)data_local + (long)(int)local_80 * 4),
                  (ulong)(uint)dims_local[(long)(int)local_80 + 8]);
          return -1;
        }
      }
      iVar1 = make_pivot_list((nifti_image *)dims_local,(int *)data_local,prods + 6,&c,&bytes);
      if (iVar1 < 0) {
        nim_local._4_4_ = 0xffffffff;
      }
      else {
        uVar2 = rci_alloc_mem((void **)fp,&c,bytes,dims_local[0x12]);
        if ((int)uVar2 < 0) {
          nim_local._4_4_ = 0xffffffff;
        }
        else {
          file = nifti_image_load_prep((nifti_image *)dims_local);
          nim_00 = dims_local;
          dims_00 = data_local;
          local_30 = file;
          if (file == (znzFile)0x0) {
            free(*(void **)fp);
            *(undefined8 *)fp = 0;
            nim_local._4_4_ = 0xffffffff;
          }
          else {
            data_00 = *(char **)fp;
            base_offset = znztell(file);
            iVar1 = rci_read_data((nifti_image *)nim_00,prods + 6,&c,bytes,(int *)dims_00,data_00,
                                  file,base_offset);
            Xznzclose(&local_30);
            if (iVar1 < 0) {
              free(*(void **)fp);
              *(undefined8 *)fp = 0;
              nim_local._4_4_ = 0xffffffff;
            }
            else {
              nim_local._4_4_ = uVar2;
              if (1 < g_opts.debug) {
                fprintf(_stderr,"+d read %d bytes of collapsed image from %s\n",(ulong)uVar2,
                        *(undefined8 *)(dims_local + 0x9e));
              }
            }
          }
        }
      }
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_read_collapsed_image( nifti_image * nim, const int dims [8],
                                void ** data )
{
   znzFile fp;
   int     pivots[8], prods[8], nprods; /* sizes are bounded by dims[], so 8 */
   int     c, bytes;

   /** - check pointers for sanity */
   if( !nim || !dims || !data ){
      fprintf(stderr,"** nifti_RCI: bad params %p, %p, %p\n",
              (void *)nim, (const void *)dims, (void *)data);
      return -1;
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d read_collapsed_image:\n        dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", dims[c]);
      fprintf(stderr,"\n   nim->dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /** - verify that dim[] makes sense */
   if( ! nifti_nim_is_valid(nim, g_opts.debug > 0) ){
      fprintf(stderr,"** invalid nim (file is '%s')\n", nim->fname );
      return -1;
   }

   /** - verify that dims[] makes sense for this dataset */
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( dims[c] >= nim->dim[c] ){
         fprintf(stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",
                 c, c, dims[c], nim->dim[c]);
         return -1;
      }
   }

   /** - prepare pivot list - pivots are fixed indices */
   if( make_pivot_list(nim, dims, pivots, prods, &nprods) < 0 ) return -1;

   bytes = rci_alloc_mem(data, prods, nprods, nim->nbyper);
   if( bytes < 0 ) return -1;

   /** - open the image file for reading at the appropriate offset */
   fp = nifti_image_load_prep( nim );
   if( ! fp ){ free(*data);  *data = NULL;  return -1; }     /* failure */

   /** - call the recursive reading function, passing nim, the pivot info,
         location to store memory, and file pointer and position */
   c = rci_read_data(nim, pivots,prods,nprods,dims,
                     (char *)*data, fp, znztell(fp));
   znzclose(fp);   /* in any case, close the file */
   if( c < 0 ){ free(*data);  *data = NULL;  return -1; }    /* failure */

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d read %d bytes of collapsed image from %s\n",
              bytes, nim->fname);

   return bytes;
}